

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getRowName(Highs *this,HighsInt row,string *name)

{
  size_type sVar1;
  const_reference pvVar2;
  string *in_RDX;
  uint in_ESI;
  long in_RDI;
  HighsInt num_row_name;
  HighsInt num_row;
  HighsStatus local_4;
  
  if (((int)in_ESI < 0) || ((int)*(uint *)(in_RDI + 0x13c) <= (int)in_ESI)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Index %d for row name is outside the range [0, num_row = %d)\n",(ulong)in_ESI,
                 (ulong)*(uint *)(in_RDI + 0x13c));
    local_4 = kError;
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x298));
    if ((int)in_ESI < (int)sVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(in_RDI + 0x298),(long)(int)in_ESI);
      std::__cxx11::string::operator=(in_RDX,(string *)pvVar2);
      local_4 = kOk;
    }
    else {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Index %d for row name is outside the range [0, num_row_name = %d)\n",
                   (ulong)in_ESI,sVar1 & 0xffffffff);
      local_4 = kError;
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getRowName(const HighsInt row, std::string& name) const {
  const HighsInt num_row = this->model_.lp_.num_row_;
  if (row < 0 || row >= num_row) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for row name is outside the range [0, num_row = %d)\n",
        int(row), int(num_row));
    return HighsStatus::kError;
  }
  const HighsInt num_row_name = this->model_.lp_.row_names_.size();
  if (row >= num_row_name) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for row name is outside the range [0, num_row_name = %d)\n",
        int(row), int(num_row_name));
    return HighsStatus::kError;
  }
  name = this->model_.lp_.row_names_[row];
  return HighsStatus::kOk;
}